

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O3

RealType __thiscall
OpenMD::EAM::Zhou2005Functional
          (EAM *this,RealType rho,RealType rhoe,RealType rhos,
          vector<double,_std::allocator<double>_> *Fn,vector<double,_std::allocator<double>_> *F,
          RealType F3plus,RealType F3minus,RealType Fe,RealType eta)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  undefined8 uVar4;
  double dVar5;
  RealType RVar6;
  double dVar7;
  
  dVar5 = rhoe * 0.85;
  if (dVar5 <= rho) {
    if ((rhoe <= rho) || (rho < dVar5)) {
      if ((rho < rhoe) || (rhoe * 1.15 <= rho)) {
        RVar6 = 0.0;
        if (rhoe * 1.15 <= rho) {
          dVar5 = pow(rho / rhos,eta);
          dVar5 = log(dVar5);
          dVar7 = pow(rho / rhos,eta);
          RVar6 = dVar7 * (1.0 - dVar5) * Fe;
        }
        return RVar6;
      }
      pdVar1 = (F->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (F->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar2 == pdVar1) goto LAB_0023bf74;
      if ((ulong)((long)pdVar2 - (long)pdVar1 >> 3) < 2) goto LAB_0023bf7f;
      if ((long)pdVar2 - (long)pdVar1 != 0x10) {
        dVar5 = rho / rhoe + -1.0;
        return ((F3plus * dVar5 + pdVar1[2]) * dVar5 + pdVar1[1]) * dVar5 + *pdVar1;
      }
    }
    else {
      pdVar1 = (F->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (F->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar2 == pdVar1) {
LAB_0023bf74:
        uVar4 = 0;
        goto LAB_0023bfa7;
      }
      if ((ulong)((long)pdVar2 - (long)pdVar1 >> 3) < 2) {
LAB_0023bf7f:
        uVar4 = 1;
        goto LAB_0023bfa7;
      }
      if ((long)pdVar2 - (long)pdVar1 != 0x10) {
        dVar5 = rho / rhoe + -1.0;
        return ((F3minus * dVar5 + pdVar1[2]) * dVar5 + pdVar1[1]) * dVar5 + *pdVar1;
      }
    }
  }
  else {
    pdVar1 = (Fn->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (Fn->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar3 = (long)pdVar2 - (long)pdVar1 >> 3;
    if (pdVar2 == pdVar1) goto LAB_0023bf74;
    if (uVar3 < 2) goto LAB_0023bf7f;
    if ((long)pdVar2 - (long)pdVar1 != 0x10) {
      if (3 < uVar3) {
        dVar5 = rho / dVar5 + -1.0;
        return ((pdVar1[3] * dVar5 + pdVar1[2]) * dVar5 + pdVar1[1]) * dVar5 + *pdVar1;
      }
      uVar4 = 3;
      goto LAB_0023bfa7;
    }
  }
  uVar4 = 2;
LAB_0023bfa7:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
}

Assistant:

RealType EAM::Zhou2005Functional(RealType rho, RealType rhoe, RealType rhos,
                                   std::vector<RealType> Fn,
                                   std::vector<RealType> F, RealType F3plus,
                                   RealType F3minus, RealType Fe,
                                   RealType eta) {
    RealType rhon = 0.85 * rhoe;
    RealType rho0 = 1.15 * rhoe;
    RealType functional(0.0);
    RealType t;
    if (rho < rhon) {
      t          = rho / rhon - 1.0;
      functional = Fn.at(0) + t * (Fn.at(1) + t * (Fn.at(2) + t * Fn.at(3)));
    } else if (rho >= rhon && rho < rhoe) {
      t          = rho / rhoe - 1.0;
      functional = F.at(0) + t * (F.at(1) + t * (F.at(2) + t * F3minus));
    } else if (rho >= rhoe && rho < rho0) {
      t          = rho / rhoe - 1.0;
      functional = F.at(0) + t * (F.at(1) + t * (F.at(2) + t * F3plus));
    } else if (rho >= rho0) {
      t          = rho / rhos;
      functional = Fe * (1.0 - log(pow(t, eta))) * pow(t, eta);
    }
    return functional;
  }